

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O3

void test_filled_and_inverted_text(wins *wins_ar,int ar_len,Am_Style *bs)

{
  long *plVar1;
  long lVar2;
  
  if (0 < ar_len) {
    lVar2 = 0;
    do {
      plVar1 = *(long **)((long)&wins_ar->font_win + lVar2);
      (**(code **)(*plVar1 + 0x170))(plVar1,&black,"FILLED",6,&font_large,0x5a,400,0,bs,0);
      (**(code **)(*plVar1 + 0x170))(plVar1,&black,"INVERTED",8,&font_large,0x5a,0x1ae,0,bs,1);
      (**(code **)(*plVar1 + 0xa0))(plVar1);
      lVar2 = lVar2 + 0x40;
    } while ((ulong)(uint)ar_len << 6 != lVar2);
  }
  return;
}

Assistant:

void
test_filled_and_inverted_text(wins *wins_ar, int ar_len, Am_Style &bs)
{
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *font_win = wins_ar[i].font_win;
    font_win->Draw_Text(black, "FILLED", 6, font_large, 90, 400, Am_DRAW_COPY,
                        bs, false);
    font_win->Draw_Text(black, "INVERTED", 8, font_large, 90, 430, Am_DRAW_COPY,
                        bs, true);
    font_win->Flush_Output();
  }
}